

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

Territory __thiscall QTimeZone::territory(QTimeZone *this)

{
  long lVar1;
  bool bVar2;
  TimeSpec TVar3;
  int iVar4;
  QTimeZonePrivate *pQVar5;
  ShortData *in_RDI;
  long in_FS_OFFSET;
  QTimeZone *in_stack_ffffffffffffffb8;
  QTimeZone *in_stack_ffffffffffffffd8;
  Territory local_12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Data::isShort((Data *)in_RDI);
  if (bVar2) {
    TVar3 = ShortData::spec(in_RDI);
    if (TVar3 == LocalTime) {
      systemTimeZone();
      local_12 = territory(in_stack_ffffffffffffffd8);
      ~QTimeZone((QTimeZone *)0x580173);
      goto LAB_005801c8;
    }
  }
  else {
    bVar2 = isValid(in_stack_ffffffffffffffb8);
    if (bVar2) {
      pQVar5 = Data::operator->((Data *)in_RDI);
      iVar4 = (*pQVar5->_vptr_QTimeZonePrivate[3])();
      local_12 = (Territory)iVar4;
      goto LAB_005801c8;
    }
  }
  local_12 = AnyCountry;
LAB_005801c8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_12;
}

Assistant:

QLocale::Territory QTimeZone::territory() const
{
    if (d.isShort()) {
        if (d.s.spec() == Qt::LocalTime)
            return systemTimeZone().territory();
    } else if (isValid()) {
        return d->territory();
    }
    return QLocale::AnyTerritory;
}